

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_get_handle_max(SESSION_HANDLE session,handle *handle_max)

{
  SESSION_INSTANCE *session_instance;
  int result;
  handle *handle_max_local;
  SESSION_HANDLE session_local;
  
  if ((session == (SESSION_HANDLE)0x0) || (handle_max == (handle *)0x0)) {
    session_instance._4_4_ = 0x43a;
  }
  else {
    *handle_max = session->handle_max;
    session_instance._4_4_ = 0;
  }
  return session_instance._4_4_;
}

Assistant:

int session_get_handle_max(SESSION_HANDLE session, handle* handle_max)
{
    int result;

    if ((session == NULL) ||
        (handle_max == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        *handle_max = session_instance->handle_max;

        result = 0;
    }

    return result;
}